

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_version.cpp
# Opt level: O2

char * ON::SourceGitRevisionHash(void)

{
  return "";
}

Assistant:

const char* ON::SourceGitRevisionHash()
{
#if defined(OPENNURBS_GIT_REVISION_HASH)
  const char* hash = OPENNURBS_GIT_REVISION_HASH;
  if (nullptr != hash && '0' == hash[0] && 0 == hash[1])
    hash = nullptr;
  if ( nullptr != hash && 0 != hash[0])
    return OPENNURBS_GIT_REVISION_HASH;
#endif
  return "";
}